

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_16bd48::SQLiteBuildDB::close(SQLiteBuildDB *this,int __fd)

{
  int iVar1;
  undefined4 in_register_00000034;
  int result;
  SQLiteBuildDB *this_local;
  
  if (this->db != (sqlite3 *)0x0) {
    sqlite3_finalize(this->findKeyIDForKeyStmt,CONCAT44(in_register_00000034,__fd));
    this->findKeyIDForKeyStmt = (sqlite3_stmt *)0x0;
    sqlite3_finalize(this->findKeyNameForKeyIDStmt);
    this->findKeyNameForKeyIDStmt = (sqlite3_stmt *)0x0;
    sqlite3_finalize(this->findRuleResultStmt);
    this->findRuleResultStmt = (sqlite3_stmt *)0x0;
    sqlite3_finalize(this->fastFindRuleResultStmt);
    this->fastFindRuleResultStmt = (sqlite3_stmt *)0x0;
    sqlite3_finalize(this->deleteFromKeysStmt);
    this->deleteFromKeysStmt = (sqlite3_stmt *)0x0;
    sqlite3_finalize(this->insertIntoKeysStmt);
    this->insertIntoKeysStmt = (sqlite3_stmt *)0x0;
    sqlite3_finalize(this->insertIntoRuleResultsStmt);
    this->insertIntoRuleResultsStmt = (sqlite3_stmt *)0x0;
    sqlite3_finalize(this->getKeysWithResultStmt);
    this->getKeysWithResultStmt = (sqlite3_stmt *)0x0;
    iVar1 = sqlite3_close(this->db);
    if (iVar1 != 0) {
      __assert_fail("result == SQLITE_OK && \"The database connection could not be closed. That means there are prepared statements that are not finalized, data blobs that are not closed or backups not finished.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                    ,0x152,"void (anonymous namespace)::SQLiteBuildDB::close()");
    }
    this->db = (sqlite3 *)0x0;
  }
  return (int)this;
}

Assistant:

void close() {
    if (!db) return;

    // Destroy prepared statements.
    sqlite3_finalize(findKeyIDForKeyStmt);
    findKeyIDForKeyStmt = nullptr;
    sqlite3_finalize(findKeyNameForKeyIDStmt);
    findKeyNameForKeyIDStmt = nullptr;
    sqlite3_finalize(findRuleResultStmt);
    findRuleResultStmt = nullptr;
    sqlite3_finalize(fastFindRuleResultStmt);
    fastFindRuleResultStmt = nullptr;
    sqlite3_finalize(deleteFromKeysStmt);
    deleteFromKeysStmt = nullptr;
    sqlite3_finalize(insertIntoKeysStmt);
    insertIntoKeysStmt = nullptr;
    sqlite3_finalize(insertIntoRuleResultsStmt);
    insertIntoRuleResultsStmt = nullptr;
    sqlite3_finalize(getKeysWithResultStmt);
    getKeysWithResultStmt = nullptr;

    int result = sqlite3_close(db);
    (void)result; // use the variable if we're building without asserts
    assert(result == SQLITE_OK && "The database connection could not be closed. That means there are prepared statements that are not finalized, data blobs that are not closed or backups not finished.");
    db = nullptr;
  }